

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codafind.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  char *definition_path;
  int i;
  int perform_conversions;
  char *filter;
  char **argv_local;
  int argc_local;
  
  _i = (char *)0x0;
  verbosity = 0;
  definition_path._4_4_ = 1;
  if (((argc == 1) || (iVar2 = strcmp(argv[1],"-h"), iVar2 == 0)) ||
     (iVar2 = strcmp(argv[1],"--help"), iVar2 == 0)) {
    print_help();
    exit(0);
  }
  iVar2 = strcmp(argv[1],"-v");
  if ((iVar2 == 0) || (iVar2 = strcmp(argv[1],"--version"), iVar2 == 0)) {
    print_version();
    exit(0);
  }
  definition_path._0_4_ = 1;
  if ((argc < 3) || (iVar2 = strcmp(argv[1],"-D"), iVar2 != 0)) {
    iVar2 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      puVar3 = (undefined4 *)coda_get_errno();
      uVar4 = coda_errno_to_string(*puVar3);
      fprintf(pFVar1,"ERROR: %s\n",uVar4);
      exit(1);
    }
  }
  else {
    coda_set_definition_path(argv[2]);
    definition_path._0_4_ = 3;
  }
  do {
    if (argc <= (int)definition_path) {
LAB_0010162a:
      if ((int)definition_path == argc) {
        fprintf(_stderr,"ERROR: invalid arguments\n");
        print_help();
        exit(1);
      }
      iVar2 = coda_init();
      pFVar1 = _stderr;
      if (iVar2 == 0) {
        coda_set_option_perform_conversions(definition_path._4_4_);
        iVar2 = coda_match_filefilter
                          (_i,argc - (int)definition_path,argv + (int)definition_path,callback,0);
        pFVar1 = _stderr;
        if (iVar2 == 0) {
          coda_done();
          return 0;
        }
        puVar3 = (undefined4 *)coda_get_errno();
        uVar4 = coda_errno_to_string(*puVar3);
        fprintf(pFVar1,"ERROR: %s\n",uVar4);
        exit(1);
      }
      puVar3 = (undefined4 *)coda_get_errno();
      uVar4 = coda_errno_to_string(*puVar3);
      fprintf(pFVar1,"ERROR: %s\n",uVar4);
      exit(1);
    }
    iVar2 = strcmp(argv[(int)definition_path],"-d");
    if ((iVar2 == 0) ||
       (iVar2 = strcmp(argv[(int)definition_path],"--disable_conversions"), iVar2 == 0)) {
      definition_path._4_4_ = 0;
    }
    else {
      iVar2 = strcmp(argv[(int)definition_path],"-f");
      if ((((iVar2 == 0) || (iVar2 = strcmp(argv[(int)definition_path],"--filter"), iVar2 == 0)) &&
          ((int)definition_path + 1 < argc)) && (*argv[(int)definition_path + 1] != '-')) {
        _i = argv[(int)definition_path + 1];
        definition_path._0_4_ = (int)definition_path + 1;
      }
      else {
        iVar2 = strcmp(argv[(int)definition_path],"-V");
        if ((iVar2 != 0) && (iVar2 = strcmp(argv[(int)definition_path],"--verbosity"), iVar2 != 0))
        {
          if (*argv[(int)definition_path] == '-') {
            fprintf(_stderr,"ERROR: invalid arguments\n");
            print_help();
            exit(1);
          }
          goto LAB_0010162a;
        }
        verbosity = 1;
      }
    }
    definition_path._0_4_ = (int)definition_path + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    char *filter = NULL;
    int perform_conversions;
    int i;

    verbosity = 0;
    perform_conversions = 1;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-f") == 0 || strcmp(argv[i], "--filter") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            filter = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbosity") == 0)
        {
            verbosity = 1;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (i == argc)
    {
        /* no files or directories provided */
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_set_option_perform_conversions(perform_conversions);

    if (coda_match_filefilter(filter, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_done();

    return 0;
}